

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall
CVmObjByteArray::restore_from_file
          (CVmObjByteArray *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *param_4)

{
  CVmFile *idx_00;
  CVmFile *pCVar1;
  uchar *buflen;
  long *in_RDI;
  CVmObjByteArray *unaff_retaddr;
  uchar *p;
  size_t chunk;
  size_t avail;
  unsigned_long rem;
  unsigned_long idx;
  unsigned_long ele_cnt;
  CVmFile *in_stack_ffffffffffffffb0;
  CVmFile *in_stack_ffffffffffffffc0;
  CVmObjByteArray *this_00;
  long *ele_count;
  
  ele_count = in_RDI;
  idx_00 = (CVmFile *)CVmFile::read_uint4(in_stack_ffffffffffffffb0);
  if (in_RDI[1] == 0) {
    alloc_array(unaff_retaddr,(unsigned_long)ele_count);
  }
  else {
    pCVar1 = (CVmFile *)get_element_count((CVmObjByteArray *)0x31a226);
    if (pCVar1 != idx_00) {
      (**(code **)(*in_RDI + 0x10))(in_RDI,0);
      alloc_array(unaff_retaddr,(unsigned_long)ele_count);
    }
  }
  this_00 = (CVmObjByteArray *)0x1;
  for (; idx_00 != (CVmFile *)0x0; idx_00 = (CVmFile *)((long)idx_00 - (long)pCVar1)) {
    buflen = get_ele_ptr(this_00,(unsigned_long)idx_00,(size_t *)in_stack_ffffffffffffffc0);
    pCVar1 = in_stack_ffffffffffffffc0;
    if (idx_00 < in_stack_ffffffffffffffc0) {
      pCVar1 = idx_00;
    }
    CVmFile::read_bytes(in_stack_ffffffffffffffc0,(char *)pCVar1,(size_t)buflen);
    this_00 = (CVmObjByteArray *)
              ((long)&(this_00->super_CVmObject)._vptr_CVmObject + (long)&pCVar1->fp_);
  }
  return;
}

Assistant:

void CVmObjByteArray::restore_from_file(VMG_ vm_obj_id_t self,
                                        CVmFile *fp, CVmObjFixup *)
{
    unsigned long ele_cnt;
    unsigned long idx;
    unsigned long rem;

    /* read the element count */
    ele_cnt = fp->read_uint4();

    /* allocate or reallocate as needed */
    if (ext_ == 0)
    {
        /* we're not yet allocated - allocate now */
        alloc_array(vmg_ ele_cnt);
    }
    else
    {
        /* already allocated - if it's a different size, reallocate */
        if (get_element_count() != ele_cnt)
        {
            /* delete the old array */
            notify_delete(vmg_ FALSE);

            /* allocate a new one */
            alloc_array(vmg_ ele_cnt);
        }
    }

    /* read the data */
    for (idx = 1, rem = ele_cnt ; rem != 0 ; )
    {
        size_t avail;
        size_t chunk;
        unsigned char *p;

        /* get the next chunk */
        p = get_ele_ptr(idx, &avail);

        /* limit this copy to the remaining bytes */
        chunk = avail;
        if (chunk > rem)
            chunk = (size_t)rem;

        /* read this chunk */
        fp->read_bytes((char *)p, chunk);

        /* advance past this chunk */
        idx += chunk;
        rem -= chunk;
    }
}